

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_51(QPDF *pdf,char *arg2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle QVar12;
  allocator<char> local_189;
  QPDFObjectHandle field;
  allocator<char> local_170 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_160 [2];
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138 [6];
  QPDFObjectHandle fields;
  QPDFObjectHandle T;
  QPDFObjectHandle acroform;
  string Tval;
  undefined1 local_b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/AcroForm",(allocator<char> *)local_160);
  QPDFObjectHandle::getKey((string *)&acroform);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&Tval._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/Fields",(allocator<char> *)&Tval);
  QPDFObjectHandle::getKey((string *)&fields);
  std::__cxx11::string::~string((string *)&w);
  iVar3 = QPDFObjectHandle::getArrayNItems();
  iVar4 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  do {
    if (iVar3 == iVar4) {
      QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
      QPDFWriter::setQDFMode(SUB81(&w,0));
      QPDFWriter::setStaticID(SUB81(&w,0));
      QPDFWriter::write();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&fields.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&acroform.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    QPDFObjectHandle::getArrayItem((int)&field);
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/T",(allocator<char> *)&Tval);
    QPDFObjectHandle::getKey((string *)&T);
    std::__cxx11::string::~string((string *)&w);
    cVar1 = QPDFObjectHandle::isString();
    if (cVar1 != '\0') {
      QPDFObjectHandle::getUTF8Value_abi_cxx11_();
      bVar2 = std::operator==(&Tval,"r1");
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"setting r1 via parent\n");
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&field);
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = extraout_RDX._M_pi;
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&local_40;
        QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)&w,QVar9);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_160,"/2",local_170);
        QPDFObjectHandle::newName((string *)local_50);
        QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
        QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&w;
        QPDFFormFieldObjectHelper::setV(QVar5,true);
        this = &local_48;
LAB_001278e6:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
        std::__cxx11::string::~string((string *)local_160);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)&w);
      }
      else {
        bVar2 = std::operator==(&Tval,"r2");
        if (bVar2) {
          std::operator<<((ostream *)&std::cout,"setting r2 via child\n");
          std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Kids",&local_189);
          QPDFObjectHandle::getKey((string *)local_170);
          QPDFObjectHandle::getArrayItem((int)local_160);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&field,local_160);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_160[0]._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
          std::__cxx11::string::~string((string *)&w);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&field);
          QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = extraout_RDX_00._M_pi;
          QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&local_60;
          QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)&w,QVar10);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_160,"/3",local_170);
          QPDFObjectHandle::newName((string *)local_70);
          QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
          QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&w;
          QPDFFormFieldObjectHelper::setV(QVar6,true);
          this = &local_68;
          goto LAB_001278e6;
        }
        bVar2 = std::operator==(&Tval,"checkbox1");
        if (bVar2) {
          std::operator<<((ostream *)&std::cout,"turning checkbox1 on\n");
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_80,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&field);
          QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = extraout_RDX_01._M_pi;
          QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&local_80;
          QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)&w,QVar11);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_160,"/Sure",local_170);
          QPDFObjectHandle::newName((string *)local_90);
          QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90;
          QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&w;
          QPDFFormFieldObjectHelper::setV(QVar7,true);
          this = &local_88;
          goto LAB_001278e6;
        }
        bVar2 = std::operator==(&Tval,"checkbox2");
        if (bVar2) {
          std::operator<<((ostream *)&std::cout,"turning checkbox2 off\n");
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_a0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&field);
          QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = extraout_RDX_02._M_pi;
          QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&local_a0;
          QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)&w,QVar12);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_160,"/Off",local_170);
          QPDFObjectHandle::newName((string *)local_b0);
          QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0;
          QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&w;
          QPDFFormFieldObjectHelper::setV(QVar8,true);
          this = &local_a8;
          goto LAB_001278e6;
        }
      }
      std::__cxx11::string::~string((string *)&Tval);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&T.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&field.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static void
test_51(QPDF& pdf, char const* arg2)
{
    // Test radio button and checkbox field setting. The input
    // files must have radios button called r1 and r2 and
    // checkboxes called checkbox1 and checkbox2. The files
    // button-set*.pdf are designed for this test case.
    QPDFObjectHandle acroform = pdf.getRoot().getKey("/AcroForm");
    QPDFObjectHandle fields = acroform.getKey("/Fields");
    int nitems = fields.getArrayNItems();
    for (int i = 0; i < nitems; ++i) {
        QPDFObjectHandle field = fields.getArrayItem(i);
        QPDFObjectHandle T = field.getKey("/T");
        if (!T.isString()) {
            continue;
        }
        std::string Tval = T.getUTF8Value();
        if (Tval == "r1") {
            std::cout << "setting r1 via parent\n";
            QPDFFormFieldObjectHelper foh(field);
            foh.setV(QPDFObjectHandle::newName("/2"));
        } else if (Tval == "r2") {
            std::cout << "setting r2 via child\n";
            field = field.getKey("/Kids").getArrayItem(1);
            QPDFFormFieldObjectHelper foh(field);
            foh.setV(QPDFObjectHandle::newName("/3"));
        } else if (Tval == "checkbox1") {
            std::cout << "turning checkbox1 on\n";
            QPDFFormFieldObjectHelper foh(field);
            // The value that eventually gets set is based on what's allowed in /N and may not match
            // this value.
            foh.setV(QPDFObjectHandle::newName("/Sure"));
        } else if (Tval == "checkbox2") {
            std::cout << "turning checkbox2 off\n";
            QPDFFormFieldObjectHelper foh(field);
            foh.setV(QPDFObjectHandle::newName("/Off"));
        }
    }
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}